

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

int yang_check_imports(lys_module *module,unres_schema *unres)

{
  byte size;
  byte size_00;
  lys_import *inc;
  char *pcVar1;
  char *pcVar2;
  lys_module *plVar3;
  lys_ext_instance **pplVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  byte bVar8;
  int iVar9;
  lys_import *plVar10;
  lys_include *plVar11;
  char *pcVar12;
  LY_ERR *pLVar13;
  ulong uVar14;
  ulong __nmemb;
  long lVar15;
  lys_import *imp;
  uint8_t local_38;
  
  imp = module->imp;
  inc = (lys_import *)module->inc;
  size = module->imp_size;
  uVar14 = (ulong)size;
  size_00 = module->inc_size;
  __nmemb = (ulong)size_00;
  if (uVar14 == 0) {
LAB_0014cdc1:
    if (__nmemb != 0) {
      plVar11 = (lys_include *)calloc(__nmemb,0x30);
      module->inc = plVar11;
      module->inc_size = '\0';
      if (plVar11 == (lys_include *)0x0) goto LAB_0014cedf;
    }
    bVar8 = 1;
    for (lVar15 = 0; uVar14 * 0x38 != lVar15; lVar15 = lVar15 + 0x38) {
      pcVar1 = *(char **)(imp->rev + lVar15 + -0x10);
      pcVar2 = *(char **)(imp->rev + lVar15 + -8);
      pcVar12 = imp->rev + lVar15 + -0x10;
      pcVar12[0] = '\0';
      pcVar12[1] = '\0';
      pcVar12[2] = '\0';
      pcVar12[3] = '\0';
      pcVar12[4] = '\0';
      pcVar12[5] = '\0';
      pcVar12[6] = '\0';
      pcVar12[7] = '\0';
      if (pcVar2 == (char *)0x0) {
        ly_vlog(LYE_MISSCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"prefix","import");
LAB_0014d00e:
        free(pcVar1);
        lydict_remove(module->ctx,*(char **)(imp->rev + lVar15 + 0x18));
        lydict_remove(module->ctx,*(char **)(imp->rev + lVar15 + 0x20));
        lys_extension_instances_free
                  (module->ctx,*(lys_ext_instance ***)(imp->rev + lVar15 + 0x10),
                   (uint)(byte)imp->rev[lVar15 + 0xb]);
LAB_0014d076:
        local_38 = '\0';
        goto LAB_0014d07e;
      }
      plVar10 = module->imp + module->imp_size;
      iVar9 = lyp_check_identifier(pcVar2,LY_IDENT_PREFIX,module,(lys_node *)0x0);
      if (iVar9 != 0) goto LAB_0014d00e;
      pcVar12 = imp->rev + lVar15 + -0x10;
      plVar10->ref = *(char **)(pcVar12 + 0x30);
      plVar3 = *(lys_module **)pcVar12;
      pcVar2 = *(char **)(pcVar12 + 8);
      pplVar4 = *(lys_ext_instance ***)(pcVar12 + 0x10);
      pcVar5 = *(char **)(pcVar12 + 0x18);
      pcVar6 = *(char **)(pcVar12 + 0x28);
      plVar10->ext = *(lys_ext_instance ***)(pcVar12 + 0x20);
      plVar10->dsc = pcVar6;
      *(lys_ext_instance ***)plVar10->rev = pplVar4;
      *(char **)(plVar10->rev + 8) = pcVar5;
      plVar10->module = plVar3;
      plVar10->prefix = pcVar2;
      pcVar12 = lydict_insert_zc(module->ctx,pcVar1);
      iVar9 = lyp_check_import(module,pcVar12,plVar10);
      lydict_remove(module->ctx,pcVar12);
      module->imp_size = module->imp_size + '\x01';
      if ((iVar9 != 0) ||
         (iVar9 = yang_check_ext_instance
                            (module,&plVar10->ext,(uint)plVar10->ext_size,plVar10,unres), iVar9 != 0
         )) goto LAB_0014d076;
      bVar8 = bVar8 + 1;
    }
    plVar10 = inc;
    for (uVar14 = 0; __nmemb != uVar14; uVar14 = uVar14 + 1) {
      plVar3 = plVar10->module;
      plVar10->module = (lys_module *)0x0;
      pcVar12 = lydict_insert_zc(module->ctx,(char *)plVar3);
      iVar9 = lyp_check_include(module,pcVar12,(lys_include *)plVar10,unres);
      if (iVar9 == 0) {
        plVar11 = module->inc;
        bVar8 = module->inc_size;
        plVar3 = plVar10->module;
        pcVar1 = plVar10->prefix;
        uVar7 = *(undefined8 *)plVar10->rev;
        pplVar4 = *(lys_ext_instance ***)(plVar10->rev + 8);
        pcVar2 = plVar10->dsc;
        plVar11[bVar8].dsc = (char *)plVar10->ext;
        (&plVar11[bVar8].dsc)[1] = pcVar2;
        *(undefined8 *)(plVar11[bVar8].rev + 8) = uVar7;
        *(lys_ext_instance ***)(plVar11[bVar8].rev + 8 + 8) = pplVar4;
        plVar11[bVar8].submodule = (lys_submodule *)plVar3;
        *(char **)plVar11[bVar8].rev = pcVar1;
        plVar11 = module->inc;
        bVar8 = module->inc_size;
        iVar9 = yang_check_ext_instance
                          (module,&plVar11[bVar8].ext,(uint)plVar11[bVar8].ext_size,plVar11 + bVar8,
                           unres);
        module->inc_size = module->inc_size + '\x01';
        lydict_remove(module->ctx,pcVar12);
        if (iVar9 != 0) goto LAB_0014d0f8;
      }
      else {
        if (iVar9 == -1) {
          lys_extension_instances_free
                    (module->ctx,*(lys_ext_instance ***)(plVar10->rev + 8),
                     (uint)(byte)plVar10->rev[3]);
          lydict_remove(module->ctx,pcVar12);
LAB_0014d0f8:
          local_38 = (char)uVar14 + '\x01';
          bVar8 = size;
          goto LAB_0014d07e;
        }
        lydict_remove(module->ctx,pcVar12);
      }
      plVar10 = (lys_import *)&plVar10->ref;
    }
    iVar9 = 0;
    plVar10 = inc;
  }
  else {
    plVar10 = (lys_import *)calloc(uVar14,0x38);
    module->imp = plVar10;
    module->imp_size = '\0';
    if (plVar10 != (lys_import *)0x0) goto LAB_0014cdc1;
LAB_0014cedf:
    pLVar13 = ly_errno_location();
    *pLVar13 = LY_EMEM;
    local_38 = '\0';
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_imports");
    bVar8 = 0;
LAB_0014d07e:
    yang_free_import(module->ctx,imp,bVar8,size);
    yang_free_include(module->ctx,(lys_include *)inc,local_38,size_00);
    iVar9 = 1;
    plVar10 = imp;
    imp = inc;
  }
  free(plVar10);
  free(imp);
  return iVar9;
}

Assistant:

int
yang_check_imports(struct lys_module *module, struct unres_schema *unres)
{
    struct lys_import *imp;
    struct lys_include *inc;
    uint8_t imp_size, inc_size, j = 0, i = 0;
    char *s;

    imp = module->imp;
    imp_size = module->imp_size;
    inc = module->inc;
    inc_size = module->inc_size;

    if (imp_size) {
        module->imp = calloc(imp_size, sizeof *module->imp);
        module->imp_size = 0;
        if (!module->imp) {
            LOGMEM;
            goto error;
        }
    }

    if (inc_size) {
        module->inc = calloc(inc_size, sizeof *module->inc);
        module->inc_size = 0;
        if (!module->inc) {
            LOGMEM;
            goto error;
        }
    }

    for (i = 0; i < imp_size; ++i) {
        s = (char *) imp[i].module;
        imp[i].module = NULL;
        if (yang_fill_import(module, &imp[i], &module->imp[module->imp_size], s, unres)) {
            ++i;
            goto error;
        }
    }
    for (j = 0; j < inc_size; ++j) {
        s = (char *) inc[j].submodule;
        inc[j].submodule = NULL;
        if (yang_fill_include(module, s, &inc[j], unres)) {
            ++j;
            goto error;
        }
    }
    free(inc);
    free(imp);

    return EXIT_SUCCESS;

error:
    yang_free_import(module->ctx, imp, i, imp_size);
    yang_free_include(module->ctx, inc, j, inc_size);
    free(imp);
    free(inc);
    return EXIT_FAILURE;
}